

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulate.h
# Opt level: O2

uint32_t __thiscall snestistics::EmulateRegisters::remap(EmulateRegisters *this,uint32_t address)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = address >> 0x10;
  uVar2 = address & 0xffff;
  if ((uVar2 < 0x8000) && ((address >> 0x16 & 1) == 0)) {
    uVar1 = 0x7e;
    if (0x1fff < uVar2) {
      uVar1 = 0;
    }
  }
  return (uVar1 & 0xff) << 0x10 | uVar2;
}

Assistant:

uint32_t remap(uint32_t address) const {
		uint8_t bank = address >> 16;
		const uint16_t a = address & 0xFFFF;
		if (a < 0x8000) {
			if ((bank >= 0x00 && bank <= 0x3f) || (bank >= 0x80 && bank <= 0xBF)) {
				if (a < 0x2000) {
					bank = 0x7E;
				} else  {
					bank = 0;
				}
			}
		}
		return (bank<<16)|a;
	}